

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decimal.cpp
# Opt level: O0

void __thiscall clickhouse::ColumnDecimal::Append(ColumnDecimal *this,Int128 *value)

{
  Code CVar1;
  element_type *peVar2;
  int128 *in_RSI;
  Column *in_stack_ffffffffffffff08;
  int128 *value_00;
  ColumnVector<absl::int128> *in_stack_ffffffffffffff10;
  ColumnVector<long> *this_00;
  Column *in_stack_ffffffffffffff28;
  Column *this_01;
  int128 local_80;
  long local_70;
  ColumnVector<long> local_68;
  int128 *local_10;
  
  local_10 = in_RSI;
  std::__shared_ptr_access<clickhouse::Column,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<clickhouse::Column,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             0x1f422d);
  Column::Type(in_stack_ffffffffffffff08);
  peVar2 = std::__shared_ptr_access<clickhouse::Type,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<clickhouse::Type,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)0x1f424c);
  CVar1 = Type::GetCode(peVar2);
  std::shared_ptr<clickhouse::Type>::~shared_ptr((shared_ptr<clickhouse::Type> *)0x1f4267);
  if (CVar1 == Int32) {
    std::__shared_ptr_access<clickhouse::Column,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
    operator->((__shared_ptr_access<clickhouse::Column,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
               0x1f4282);
    Column::As<clickhouse::ColumnVector<int>>(in_stack_ffffffffffffff28);
    std::
    __shared_ptr_access<clickhouse::ColumnVector<int>,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
    operator->((__shared_ptr_access<clickhouse::ColumnVector<int>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                *)0x1f42a1);
    local_68.super_Column.type_.super___shared_ptr<clickhouse::Type,_(__gnu_cxx::_Lock_policy)2>.
    _M_refcount._M_pi._4_4_ = absl::int128::operator_cast_to_int(local_10);
    ColumnVector<int>::Append
              ((ColumnVector<int> *)in_stack_ffffffffffffff10,(int *)in_stack_ffffffffffffff08);
    std::shared_ptr<clickhouse::ColumnVector<int>_>::~shared_ptr
              ((shared_ptr<clickhouse::ColumnVector<int>_> *)0x1f42e5);
  }
  else {
    std::__shared_ptr_access<clickhouse::Column,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
    operator->((__shared_ptr_access<clickhouse::Column,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
               0x1f4344);
    this_01 = (Column *)
              &local_68.super_Column.super_enable_shared_from_this<clickhouse::Column>._M_weak_this.
               super___weak_ptr<clickhouse::Column,_(__gnu_cxx::_Lock_policy)2>._M_refcount;
    Column::Type(in_stack_ffffffffffffff08);
    peVar2 = std::__shared_ptr_access<clickhouse::Type,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<clickhouse::Type,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)0x1f4363);
    CVar1 = Type::GetCode(peVar2);
    std::shared_ptr<clickhouse::Type>::~shared_ptr((shared_ptr<clickhouse::Type> *)0x1f437e);
    if (CVar1 == Int64) {
      std::__shared_ptr_access<clickhouse::Column,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
      operator->((__shared_ptr_access<clickhouse::Column,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  *)0x1f4399);
      this_00 = &local_68;
      Column::As<clickhouse::ColumnVector<long>>(this_01);
      std::
      __shared_ptr_access<clickhouse::ColumnVector<long>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
      ::operator->((__shared_ptr_access<clickhouse::ColumnVector<long>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                    *)0x1f43b8);
      local_70 = absl::int128::operator_cast_to_long(local_10);
      ColumnVector<long>::Append(this_00,(long *)in_stack_ffffffffffffff08);
      std::shared_ptr<clickhouse::ColumnVector<long>_>::~shared_ptr
                ((shared_ptr<clickhouse::ColumnVector<long>_> *)0x1f43ff);
    }
    else {
      std::__shared_ptr_access<clickhouse::Column,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
      operator->((__shared_ptr_access<clickhouse::Column,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  *)0x1f445b);
      value_00 = &local_80;
      Column::As<clickhouse::ColumnVector<absl::int128>>(this_01);
      std::
      __shared_ptr_access<clickhouse::ColumnVector<absl::int128>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
      ::operator->((__shared_ptr_access<clickhouse::ColumnVector<absl::int128>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                    *)0x1f4475);
      ColumnVector<absl::int128>::Append(in_stack_ffffffffffffff10,value_00);
      std::shared_ptr<clickhouse::ColumnVector<absl::int128>_>::~shared_ptr
                ((shared_ptr<clickhouse::ColumnVector<absl::int128>_> *)0x1f449e);
    }
  }
  return;
}

Assistant:

void ColumnDecimal::Append(const Int128& value) {
    if (data_->Type()->GetCode() == Type::Int32) {
        data_->As<ColumnInt32>()->Append(static_cast<ColumnInt32::DataType>(value));
    } else if (data_->Type()->GetCode() == Type::Int64) {
        data_->As<ColumnInt64>()->Append(static_cast<ColumnInt64::DataType>(value));
    } else {
        data_->As<ColumnInt128>()->Append(static_cast<ColumnInt128::DataType>(value));
    }
}